

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbararealayout.cpp
# Opt level: O0

QSize __thiscall QToolBarAreaLayoutInfo::sizeHint(QToolBarAreaLayoutInfo *this)

{
  bool bVar1;
  int iVar2;
  qsizetype qVar3;
  int *piVar4;
  QList<QToolBarAreaLayoutLine> *in_RDI;
  long in_FS_OFFSET;
  QToolBarAreaLayoutLine *l;
  int i;
  int b;
  QSize hint;
  int a;
  QSize result;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  QList<QToolBarAreaLayoutLine> *in_stack_ffffffffffffffa0;
  QSize *this_00;
  Orientation o;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  int local_30;
  int local_2c;
  int in_stack_ffffffffffffffe0;
  int local_14;
  QSize local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_14 = 0;
  local_2c = 0;
  for (local_30 = 0; qVar3 = QList<QToolBarAreaLayoutLine>::size(in_RDI), local_30 < qVar3;
      local_30 = local_30 + 1) {
    QList<QToolBarAreaLayoutLine>::at
              (in_stack_ffffffffffffffa0,
               CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    bVar1 = QToolBarAreaLayoutLine::skip
                      ((QToolBarAreaLayoutLine *)
                       CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    if (!bVar1) {
      QToolBarAreaLayoutLine::sizeHint
                ((QToolBarAreaLayoutLine *)CONCAT44(0xaaaaaaaa,in_stack_ffffffffffffffe0));
      in_stack_ffffffffffffffe0 =
           pick((Orientation)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
                (QSize *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
      piVar4 = qMax<int>(&local_14,(int *)&stack0xffffffffffffffe0);
      local_14 = *piVar4;
      iVar2 = perp((Orientation)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
                   (QSize *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
      local_2c = iVar2 + local_2c;
    }
  }
  local_10 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
  this_00 = &local_10;
  QSize::QSize(this_00);
  o = (Orientation)((ulong)this_00 >> 0x20);
  iVar2 = local_14;
  piVar4 = rpick(o,(QSize *)CONCAT44(local_14,in_stack_ffffffffffffff98));
  *piVar4 = iVar2;
  piVar4 = rperp(o,(QSize *)CONCAT44(iVar2,in_stack_ffffffffffffff98));
  *piVar4 = local_2c;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_10;
}

Assistant:

QSize QToolBarAreaLayoutInfo::sizeHint() const
{
    int a = 0, b = 0;
    for (int i = 0; i < lines.size(); ++i) {
        const QToolBarAreaLayoutLine &l = lines.at(i);
        if (l.skip())
            continue;

        QSize hint = l.sizeHint();
        a = qMax(a, pick(o, hint));
        b += perp(o, hint);
    }

    QSize result;
    rpick(o, result) = a;
    rperp(o, result) = b;

    return result;
}